

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int av1_find_best_sub_pixel_tree_pruned_more
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  MV_COST_PARAMS *mv_cost_params;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  SubpelMvLimits *mv_limits;
  byte bVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  MV MVar6;
  int iVar7;
  int *cost_list;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  scale_factors *psVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  int iVar16;
  MV *pMVar17;
  int iVar18;
  short sVar19;
  long lVar20;
  short sVar21;
  uint is_scaled;
  uint besterr;
  MV left_mv;
  int dummy;
  MV right_mv;
  MV top_mv;
  MV local_48;
  MV bottom_mv;
  
  iVar4 = ms_params->allow_hp;
  bVar1 = ms_params->forced_stop;
  iVar5 = ms_params->iters_per_step;
  cost_list = ms_params->cost_list;
  besterr = 0x7fffffff;
  sVar13 = start_mv.row;
  bestmv->row = sVar13;
  sVar19 = start_mv.col;
  bestmv->col = sVar19;
  if (((*xd->mi)->field_0xa7 & 0x80) == 0) {
    psVar12 = xd->block_ref_scale_factors[0];
  }
  else {
    psVar12 = &cm->sf_identity;
  }
  is_scaled = 0;
  if (((psVar12->x_scale_fp != -1) && (psVar12->y_scale_fp != -1)) &&
     (is_scaled = 1, psVar12->x_scale_fp == 0x4000)) {
    is_scaled = (uint)(psVar12->y_scale_fp != 0x4000);
  }
  mv_cost_params = &ms_params->mv_cost_params;
  var_params = &ms_params->var_params;
  if ((start_mv_stats == (FULLPEL_MV_STATS *)0x0) || (is_scaled != 0)) {
    if (is_scaled == 0) {
      besterr = setup_center_error(xd,bestmv,var_params,mv_cost_params,sse1,distortion);
    }
    else {
      besterr = upsampled_setup_center_error(xd,cm,bestmv,var_params,mv_cost_params,sse1,distortion)
      ;
    }
  }
  else {
    besterr = start_mv_stats->err_cost + start_mv_stats->distortion;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  }
  if (bVar1 == 3) {
    return besterr;
  }
  if (last_mv_search_list != (int_mv *)0x0) {
    MVar6 = *bestmv;
    if ((MVar6.row == (last_mv_search_list->as_mv).row) &&
       ((int)MVar6 >> 0x10 == (int)(last_mv_search_list->as_mv).col)) {
      return 0x7fffffff;
    }
    (last_mv_search_list->as_mv).row = MVar6.row;
    (last_mv_search_list->as_mv).col = MVar6.col;
  }
  mv_limits = &ms_params->mv_limits;
  if (((((cost_list == (int *)0x0) || (iVar18 = *cost_list, iVar18 == 0x7fffffff)) ||
       (iVar16 = cost_list[1], iVar16 == 0x7fffffff)) ||
      ((cost_list[2] == 0x7fffffff || (iVar7 = cost_list[3], iVar7 == 0x7fffffff)))) ||
     ((cost_list[4] == 0x7fffffff ||
      ((cost_list[4] <= iVar18 || iVar7 <= iVar18) || (cost_list[2] <= iVar18 || iVar16 <= iVar18)))
     )) {
    iVar18 = (int)start_mv >> 0x10;
    left_mv.col = sVar19 + -4;
    left_mv.row = sVar13;
    dummy = 0;
    uVar8 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                              sse1,distortion,&dummy,is_scaled);
    right_mv.col = sVar19 + 4;
    right_mv.row = sVar13;
    uVar9 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                              sse1,distortion,&dummy,is_scaled);
    top_mv.col = sVar19;
    top_mv.row = sVar13 + -4;
    uVar10 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                               sse1,distortion,&dummy,is_scaled);
    bottom_mv.row = sVar13 + 4;
    bottom_mv.col = sVar19;
    uVar11 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                               sse1,distortion,&dummy,is_scaled);
    sVar21 = -4;
    if (uVar11 < uVar10) {
      sVar21 = 4;
    }
    sVar14 = -4;
    if (uVar9 < uVar8) {
      sVar14 = 4;
    }
    local_48.row = sVar21 + sVar13;
    local_48.col = sVar19 + sVar14;
    check_better_fast(xd,cm,&local_48,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                      distortion,&dummy,is_scaled);
    if (1 < iVar5) {
      sVar19 = bestmv->row;
      sVar15 = bestmv->col;
      iVar16 = (int)sVar15;
      left_mv.row = 0;
      left_mv.col = 0;
      if (iVar18 == iVar16 || sVar13 == sVar19) {
        if (sVar13 == sVar19 && iVar18 != iVar16) {
          right_mv.col = sVar15 + sVar14;
          dummy = CONCAT22(right_mv.col,sVar19 + 4);
          right_mv.row = sVar19 + -4;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                            sse1,distortion,(int *)&left_mv,is_scaled);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1
                            ,distortion,(int *)&left_mv,is_scaled);
          pMVar17 = &top_mv;
          top_mv.col = sVar15;
          top_mv.row = sVar19 - sVar21;
        }
        else {
          if (sVar13 == sVar19 || iVar18 != iVar16) goto LAB_002fabe8;
          right_mv.row = sVar21 + sVar19;
          dummy = CONCAT22(sVar15 + 4,right_mv.row);
          right_mv.col = sVar15 + -4;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                            sse1,distortion,(int *)&left_mv,is_scaled);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1
                            ,distortion,(int *)&left_mv,is_scaled);
          pMVar17 = &top_mv;
          top_mv.col = sVar15 - sVar14;
          top_mv.row = sVar19;
        }
      }
      else {
        dummy = CONCAT22(sVar15 + sVar14,sVar19);
        right_mv.row = sVar19 + sVar21;
        right_mv.col = sVar15;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        pMVar17 = &right_mv;
      }
      check_better_fast(xd,cm,pMVar17,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                        distortion,(int *)&left_mv,is_scaled);
    }
  }
  else {
    get_cost_surf_min(cost_list,(int *)&left_mv,&dummy,
                      CONCAT31((int3)((uint)iVar16 >> 8),iVar7 <= iVar18));
    if (left_mv != (MV)0x0 || dummy != 0) {
      right_mv.row = sVar13 + left_mv.row * 4;
      right_mv.col = sVar19 + (short)dummy * 4;
      top_mv.row = 0;
      top_mv.col = 0;
      check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                        distortion,(int *)&top_mv,is_scaled);
    }
  }
LAB_002fabe8:
  if (1 < bVar1) {
    sVar13 = 2;
    lVar20 = 1;
    goto LAB_002fb1e9;
  }
  if (last_mv_search_list != (int_mv *)0x0) {
    MVar6 = *bestmv;
    if ((MVar6.row == last_mv_search_list[1].as_mv.row) &&
       ((int)MVar6 >> 0x10 == (int)*(short *)((long)last_mv_search_list + 6))) {
      return 0x7fffffff;
    }
    last_mv_search_list[1].as_mv.row = MVar6.row;
    *(int16_t *)((long)last_mv_search_list + 6) = MVar6.col;
  }
  sVar19 = bestmv->row;
  sVar21 = bestmv->col;
  left_mv.col = sVar21 + -2;
  left_mv.row = sVar19;
  dummy = 0;
  uVar8 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                            distortion,&dummy,is_scaled);
  right_mv.col = sVar21 + 2;
  right_mv.row = sVar19;
  uVar9 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1
                            ,distortion,&dummy,is_scaled);
  top_mv.col = sVar21;
  top_mv.row = sVar19 + -2;
  uVar10 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                             distortion,&dummy,is_scaled);
  bottom_mv.row = sVar19 + 2;
  bottom_mv.col = sVar21;
  uVar11 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                             sse1,distortion,&dummy,is_scaled);
  sVar14 = -2;
  if (uVar11 < uVar10) {
    sVar14 = 2;
  }
  sVar15 = -2;
  if (uVar9 < uVar8) {
    sVar15 = 2;
  }
  local_48.row = sVar19 + sVar14;
  local_48.col = sVar21 + sVar15;
  check_better_fast(xd,cm,&local_48,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                    distortion,&dummy,is_scaled);
  sVar13 = 1;
  if (1 < iVar5) {
    sVar2 = bestmv->row;
    sVar3 = bestmv->col;
    left_mv.row = 0;
    left_mv.col = 0;
    if (sVar21 == sVar3 || sVar19 == sVar2) {
      if (sVar19 == sVar2 && sVar21 != sVar3) {
        right_mv.col = sVar3 + sVar15;
        dummy = CONCAT22(right_mv.col,sVar2 + 2);
        right_mv.row = sVar2 + -2;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                          distortion,(int *)&left_mv,is_scaled);
        top_mv.col = sVar3;
        top_mv.row = sVar2 - sVar14;
      }
      else {
        if (sVar19 == sVar2 || sVar21 != sVar3) goto LAB_002fb1dd;
        right_mv.row = sVar14 + sVar2;
        dummy = CONCAT22(sVar3 + 2,right_mv.row);
        right_mv.col = sVar3 + -2;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                          distortion,(int *)&left_mv,is_scaled);
        top_mv.col = sVar3 - sVar15;
        top_mv.row = sVar2;
      }
      check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                        distortion,(int *)&left_mv,is_scaled);
    }
    else {
      dummy = CONCAT22(sVar3 + sVar15,sVar2);
      right_mv.row = sVar2 + sVar14;
      right_mv.col = sVar3;
      check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                        distortion,(int *)&left_mv,is_scaled);
      check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                        distortion,(int *)&left_mv,is_scaled);
    }
  }
LAB_002fb1dd:
  lVar20 = 2;
LAB_002fb1e9:
  if (bVar1 == 0 && iVar4 != 0) {
    if (last_mv_search_list != (int_mv *)0x0) {
      MVar6 = *bestmv;
      if ((MVar6.row == last_mv_search_list[lVar20].as_mv.row) &&
         ((int)MVar6 >> 0x10 == (int)*(short *)((long)last_mv_search_list + lVar20 * 4 + 2))) {
        return 0x7fffffff;
      }
      last_mv_search_list[lVar20].as_mv.row = MVar6.row;
      *(int16_t *)((long)last_mv_search_list + lVar20 * 4 + 2) = MVar6.col;
    }
    sVar19 = bestmv->row;
    sVar21 = bestmv->col;
    left_mv.col = sVar21 - sVar13;
    left_mv.row = sVar19;
    dummy = 0;
    uVar8 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                              sse1,distortion,&dummy,is_scaled);
    right_mv.col = sVar21 + sVar13;
    right_mv.row = sVar19;
    uVar9 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                              sse1,distortion,&dummy,is_scaled);
    top_mv.col = sVar21;
    top_mv.row = sVar19 - sVar13;
    uVar10 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                               sse1,distortion,&dummy,is_scaled);
    bottom_mv.row = sVar19 + sVar13;
    bottom_mv.col = sVar21;
    uVar11 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                               sse1,distortion,&dummy,is_scaled);
    sVar14 = -sVar13;
    if (uVar11 < uVar10) {
      sVar14 = sVar13;
    }
    sVar15 = -sVar13;
    if (uVar9 < uVar8) {
      sVar15 = sVar13;
    }
    local_48.row = sVar19 + sVar14;
    local_48.col = sVar21 + sVar15;
    check_better_fast(xd,cm,&local_48,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                      distortion,&dummy,is_scaled);
    if (1 < iVar5) {
      sVar2 = bestmv->row;
      sVar3 = bestmv->col;
      left_mv.row = 0;
      left_mv.col = 0;
      if (sVar21 == sVar3 || sVar19 == sVar2) {
        if (sVar19 == sVar2 && sVar21 != sVar3) {
          right_mv.col = sVar3 + sVar15;
          dummy = CONCAT22(right_mv.col,sVar13 + sVar2);
          right_mv.row = sVar2 - sVar13;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                            sse1,distortion,(int *)&left_mv,is_scaled);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1
                            ,distortion,(int *)&left_mv,is_scaled);
          pMVar17 = &top_mv;
          top_mv.col = sVar3;
          top_mv.row = sVar2 - sVar14;
        }
        else {
          if (sVar19 == sVar2 || sVar21 != sVar3) {
            return besterr;
          }
          right_mv.row = sVar14 + sVar2;
          dummy = CONCAT22(sVar3 + sVar13,right_mv.row);
          right_mv.col = sVar3 - sVar13;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                            sse1,distortion,(int *)&left_mv,is_scaled);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1
                            ,distortion,(int *)&left_mv,is_scaled);
          pMVar17 = &top_mv;
          top_mv.col = sVar3 - sVar15;
          top_mv.row = sVar2;
        }
      }
      else {
        dummy = CONCAT22(sVar3 + sVar15,sVar2);
        right_mv.row = sVar2 + sVar14;
        right_mv.col = sVar3;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        pMVar17 = &right_mv;
      }
      check_better_fast(xd,cm,pMVar17,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                        distortion,(int *)&left_mv,is_scaled);
    }
  }
  return besterr;
}

Assistant:

int av1_find_best_sub_pixel_tree_pruned_more(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, MV start_mv,
    const FULLPEL_MV_STATS *start_mv_stats, MV *bestmv, int *distortion,
    unsigned int *sse1, int_mv *last_mv_search_list) {
  (void)cm;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const int *cost_list = ms_params->cost_list;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;

  // The iteration we are current searching for. Iter 0 corresponds to fullpel
  // mv, iter 1 to half pel, and so on
  int iter = 0;
  int hstep = INIT_SUBPEL_STEP_SIZE;  // Step size, initialized to 4/8=1/2 pel
  unsigned int besterr = INT_MAX;
  *bestmv = start_mv;

  const struct scale_factors *const sf = is_intrabc_block(xd->mi[0])
                                             ? &cm->sf_identity
                                             : xd->block_ref_scale_factors[0];
  const int is_scaled = av1_is_scaled(sf);

  if (start_mv_stats != NULL && !is_scaled) {
    besterr = start_mv_stats->distortion + start_mv_stats->err_cost;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  } else {
    besterr =
        setup_center_error_facade(xd, cm, bestmv, var_params, mv_cost_params,
                                  sse1, distortion, is_scaled);
  }

  // If forced_stop is FULL_PEL, return.
  if (forced_stop == FULL_PEL) return besterr;

  if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
    return INT_MAX;
  }
  iter++;

  if (cost_list && cost_list[0] != INT_MAX && cost_list[1] != INT_MAX &&
      cost_list[2] != INT_MAX && cost_list[3] != INT_MAX &&
      cost_list[4] != INT_MAX && is_cost_list_wellbehaved(cost_list)) {
    int ir, ic;
    get_cost_surf_min(cost_list, &ir, &ic, 1);
    if (ir != 0 || ic != 0) {
      const MV this_mv = { start_mv.row + ir * hstep,
                           start_mv.col + ic * hstep };
      int dummy = 0;
      check_better_fast(xd, cm, &this_mv, bestmv, mv_limits, var_params,
                        mv_cost_params, &besterr, sse1, distortion, &dummy,
                        is_scaled);
    }
  } else {
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  // Each subsequent iteration checks at least one point in common with
  // the last iteration could be 2 ( if diag selected) 1/4 pel
  if (forced_stop < HALF_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  if (allow_hp && forced_stop == EIGHTH_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  return besterr;
}